

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::FillScopeObject
              (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var frameObj,
              Var *paramAddr,PropertyIdArray *propIds,HeapArgumentsObject *argsObj,
              ScriptContext *scriptContext,bool nonSimpleParamList,bool useCachedScope)

{
  DynamicTypeHandler *newTypeHandler;
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptGeneratorFunction *pJVar6;
  FunctionBody *pFVar7;
  DynamicType *pDVar8;
  Var pvVar9;
  ES5HeapArgumentsObject *pEVar10;
  PropertyAttributes extraAttributes;
  ulong uVar11;
  Type TVar12;
  GeneratorVirtualScriptFunction *this;
  ulong uVar13;
  ulong uVar14;
  
  uVar13 = (ulong)formalsCount;
  if (frameObj == (Var)0x0 && formalsCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1d31,"(formalsCount == 0 || frameObj != nullptr)",
                                "formalsCount == 0 || frameObj != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  else if (formalsCount == 0) goto LAB_009a5c81;
  if (useCachedScope) {
    frameObj = VarTo<Js::DynamicObject>(frameObj);
  }
  else {
    if (nonSimpleParamList) {
      bVar3 = VarIsImpl<Js::JavascriptGeneratorFunction>((RecyclableObject *)funcCallee);
      this = (GeneratorVirtualScriptFunction *)funcCallee;
      if (bVar3) {
        pJVar6 = UnsafeVarTo<Js::JavascriptGeneratorFunction,Js::JavascriptFunction>(funcCallee);
        this = (pJVar6->scriptFunction).ptr;
      }
      pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
      if ((pFVar7->field_0x17b & 2) == 0) {
        pDVar8 = *(DynamicType **)((long)frameObj + 8);
        extraAttributes = 'G';
        goto LAB_009a5b7d;
      }
      pDVar8 = PathTypeHandlerBase::CreateNewScopeObject<true>
                         (scriptContext,*(DynamicType **)((long)frameObj + 8),propIds,'G',0xffffffff
                         );
    }
    else {
      pDVar8 = *(DynamicType **)((long)frameObj + 8);
      extraAttributes = '\0';
LAB_009a5b7d:
      pDVar8 = PathTypeHandlerBase::CreateNewScopeObject<false>
                         (scriptContext,pDVar8,propIds,extraAttributes,0xffffffff);
    }
    newTypeHandler = (pDVar8->typeHandler).ptr;
    DynamicObject::EnsureSlots
              ((DynamicObject *)frameObj,
               *(int *)(*(long *)(*(long *)((long)frameObj + 8) + 0x28) + 0xc),
               newTypeHandler->slotCapacity,scriptContext,newTypeHandler);
    DynamicObject::ReplaceType((DynamicObject *)frameObj,pDVar8);
  }
  if (nonSimpleParamList && argsObj != (HeapArgumentsObject *)0x0) {
    pvVar9 = ConvertToUnmappedArguments
                       (argsObj,actualsCount,paramAddr,(DynamicObject *)frameObj,propIds,
                        formalsCount,scriptContext);
    return pvVar9;
  }
  uVar2 = actualsCount;
  if (formalsCount < actualsCount) {
    uVar2 = formalsCount;
  }
  uVar14 = (ulong)uVar2;
  for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
    TVar12 = 0xffffffff;
    if (propIds != (PropertyIdArray *)0x0) {
      TVar12 = (&propIds[1].count)[uVar11];
    }
    DynamicObject::SetSlot((DynamicObject *)frameObj,TVar12,false,(int)uVar11,paramAddr[uVar11]);
  }
  if (uVar11 < uVar13) {
    for (; (formalsCount - uVar2) + (int)uVar11 != uVar14; uVar14 = uVar14 + 1) {
      TVar12 = 0xffffffff;
      if (propIds != (PropertyIdArray *)0x0) {
        TVar12 = (&propIds[1].count)[uVar14];
      }
      DynamicObject::SetSlot
                ((DynamicObject *)frameObj,TVar12,false,(int)uVar14,
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr);
    }
  }
LAB_009a5c81:
  if (argsObj == (HeapArgumentsObject *)0x0) {
    argsObj = (HeapArgumentsObject *)0x0;
  }
  else {
    for (; (uint)uVar13 < actualsCount; uVar13 = uVar13 + 1) {
      SetItem(argsObj,(RecyclableObject *)argsObj,(uint)uVar13,paramAddr[uVar13],scriptContext,
              PropertyOperation_None,1);
    }
    BVar4 = JavascriptFunction::IsStrictMode(funcCallee);
    if (BVar4 != 0) {
      pEVar10 = HeapArgumentsObject::ConvertToUnmappedArgumentsObject(argsObj,!nonSimpleParamList);
      return pEVar10;
    }
  }
  return argsObj;
}

Assistant:

Var JavascriptOperators::FillScopeObject(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var frameObj, Var * paramAddr,
        Js::PropertyIdArray *propIds, HeapArgumentsObject * argsObj, ScriptContext * scriptContext, bool nonSimpleParamList, bool useCachedScope)
    {
        Assert(formalsCount == 0 || frameObj != nullptr);

        // Transfer formal arguments (that were actually passed) from their ArgIn slots to the local frame object.
        uint32 i;

        Var *tmpAddr = paramAddr;

        if (formalsCount != 0)
        {
            DynamicObject* frameObject = nullptr;
            if (useCachedScope)
            {
                frameObject = VarTo<DynamicObject>(frameObj);
                __analysis_assume((uint32)frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity() >= formalsCount);
            }
            else
            {
                frameObject = (DynamicObject*)frameObj;
                // No fixed fields for formal parameters of the arguments object.  Also, mark all fields as initialized up-front, because
                // we will set them directly using SetSlot below, so the type handler will not have a chance to mark them as initialized later.
                // CONSIDER : When we delay type sharing until the second instance is created, pass an argument indicating we want the types
                // and handlers created here to be marked as shared up-front. This is to ensure we don't get any fixed fields and that the handler
                // is ready for storing values directly to slots.
                DynamicType* newType = nullptr;
                if (nonSimpleParamList)
                {
                    bool skipLetAttrForArguments = ( VarIs<JavascriptGeneratorFunction>(funcCallee) ?
                        UnsafeVarTo<JavascriptGeneratorFunction>(funcCallee)->GetGeneratorVirtualScriptFunction()->GetFunctionBody()->HasReferenceableBuiltInArguments()
                        : funcCallee->GetFunctionBody()->HasReferenceableBuiltInArguments());

                    if (skipLetAttrForArguments)
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                    else
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                }
                else
                {
                    newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds);
                }
                int oldSlotCapacity = frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity();
                int newSlotCapacity = newType->GetTypeHandler()->GetSlotCapacity();
                __analysis_assume((uint32)newSlotCapacity >= formalsCount);

                frameObject->EnsureSlots(oldSlotCapacity, newSlotCapacity, scriptContext, newType->GetTypeHandler());
                frameObject->ReplaceType(newType);
            }

            if (argsObj && nonSimpleParamList)
            {
                return ConvertToUnmappedArguments(argsObj, actualsCount, paramAddr, frameObject, propIds, formalsCount, scriptContext);
            }

            for (i = 0; i < formalsCount && i < actualsCount; i++, tmpAddr++)
            {
                frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, *tmpAddr));
            }

            if (i < formalsCount)
            {
                // The formals that weren't passed still need to be put in the frame object so that
                // their names will be found. Initialize them to "undefined".
                for (; i < formalsCount; i++)
                {
                    frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, scriptContext->GetLibrary()->GetUndefined()));
                }
            }
        }

        if (argsObj != nullptr)
        {
            // Transfer the unnamed actual arguments, if any, to the Arguments object itself.
            for (i = formalsCount, tmpAddr = paramAddr + i; i < actualsCount; i++, tmpAddr++)
            {
                // ES5 10.6.11: use [[DefineOwnProperty]] semantics (instead of [[Put]]):
                // do not check whether property is non-writable/etc in the prototype.
                // ES3 semantics is same.
                JavascriptOperators::SetItem(argsObj, argsObj, i, *tmpAddr, scriptContext, PropertyOperation_None, /* skipPrototypeCheck = */ TRUE);
            }

            if (funcCallee->IsStrictMode())
            {
                // If the formals are let decls, then we just overwrote the frame object slots with
                // Undecl sentinels, and we can use the original arguments that were passed to the HeapArgumentsObject.
                return argsObj->ConvertToUnmappedArgumentsObject(!nonSimpleParamList);
            }
        }
        return argsObj;
    }